

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O2

int test_twin_with_device_client
              (BACK_COMPAT_HANDLE handle,DEVICE_CREATION_TYPE create_type,
              IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  _Bool _Var1;
  IOTHUB_CLIENT_RESULT IVar2;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE iotHubClientHandle;
  LOGGER_LOG p_Var3;
  int iVar4;
  size_t timeout_seconds;
  int iVar5;
  char *pcVar6;
  BACK_COMPAT_MSG_CTX bc_msg_ctx;
  tickcounter_ms_t start_time;
  
  bc_msg_ctx.twin_callback_recv = false;
  bc_msg_ctx.callback_recv = false;
  bc_msg_ctx.connected = false;
  iotHubClientHandle = create_device_client(handle,create_type,protocol);
  if (iotHubClientHandle == (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x2ec;
    }
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
              ,"test_twin_with_device_client",0x2eb,1,"Failure creating davice client");
    return 0x2ec;
  }
  IVar2 = IoTHubDeviceClient_LL_SetConnectionStatusCallback
                    (iotHubClientHandle,connection_status_callback,&bc_msg_ctx);
  if (IVar2 == IOTHUB_CLIENT_OK) {
    IVar2 = IoTHubDeviceClient_LL_SetDeviceTwinCallback
                      (iotHubClientHandle,device_twin_callback,&bc_msg_ctx);
    if (IVar2 == IOTHUB_CLIENT_OK) {
      tickcounter_get_current_ms(handle->tick_cntr_handle,&start_time);
      do {
        if (bc_msg_ctx.twin_callback_recv == true) {
          if (bc_msg_ctx.callback_recv != false) {
            iVar5 = 0;
            goto LAB_0011df80;
          }
          IVar2 = IoTHubDeviceClient_LL_GetTwinAsync
                            (iotHubClientHandle,device_twin_callback,&bc_msg_ctx);
          if (IVar2 != IOTHUB_CLIENT_OK) {
            p_Var3 = xlogging_get_log_function();
            iVar5 = 0x30e;
            if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011df80;
            pcVar6 = "Failure setting twin callback";
            iVar4 = 0x30d;
            goto LAB_0011df7b;
          }
          bc_msg_ctx.callback_recv = bc_msg_ctx.twin_callback_recv;
          bc_msg_ctx.twin_callback_recv = false;
        }
        IoTHubDeviceClient_LL_DoWork(iotHubClientHandle);
        _Var1 = is_operation_timed_out(handle->tick_cntr_handle,start_time,timeout_seconds);
      } while (!_Var1);
      iVar5 = 0x2ff;
      goto LAB_0011df80;
    }
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x2f8;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011df80;
    pcVar6 = "Failure setting twin asynccallback";
    iVar4 = 0x2f7;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x2f3;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011df80;
    pcVar6 = "Failure setting connection status callback";
    iVar4 = 0x2f2;
  }
LAB_0011df7b:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
            ,"test_twin_with_device_client",iVar4,1,pcVar6);
LAB_0011df80:
  IoTHubDeviceClient_LL_Destroy(iotHubClientHandle);
  if (handle->transport_handle != (TRANSPORT_HANDLE)0x0) {
    IoTHubTransport_Destroy(handle->transport_handle);
  }
  return iVar5;
}

Assistant:

int test_twin_with_device_client(BACK_COMPAT_HANDLE handle, DEVICE_CREATION_TYPE create_type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    int result;
    BACK_COMPAT_MSG_CTX bc_msg_ctx = { 0 };
    IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client = create_device_client(handle, create_type, protocol);
    if (device_client == NULL)
    {
        LogError("Failure creating davice client");
        result = __LINE__;
    }
    else
    {
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetConnectionStatusCallback(device_client, connection_status_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting connection status callback");
            result = __LINE__;
        }
        else if (!check_iothub_result(IoTHubDeviceClient_LL_SetDeviceTwinCallback(device_client, device_twin_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting twin asynccallback");
            result = __LINE__;
        }
        else
        {
            tickcounter_ms_t start_time;
            bool continue_run = true;
            (void)tickcounter_get_current_ms(handle->tick_cntr_handle, &start_time);
            result = __LINE__;
            do
            {
                if (bc_msg_ctx.twin_callback_recv)
                {
                    if (bc_msg_ctx.callback_recv)
                    {
                        // Second callback we have succeeded
                        result = 0;
                        continue_run = false;
                        break;
                    }
                    else if (!check_iothub_result(IoTHubDeviceClient_LL_GetTwinAsync(device_client, device_twin_callback, &bc_msg_ctx)))
                    {
                        LogError("Failure setting twin callback");
                        result = __LINE__;
                        break;
                    }
                    else
                    {
                        bc_msg_ctx.callback_recv = bc_msg_ctx.twin_callback_recv;
                        // Wait for the second callback to get called
                        bc_msg_ctx.twin_callback_recv = false;
                    }
                }
                IoTHubDeviceClient_LL_DoWork(device_client);
            } while (continue_run && !is_operation_timed_out(handle->tick_cntr_handle, start_time, MAX_OPERATION_TIMEOUT) );
        }
        IoTHubDeviceClient_LL_Destroy(device_client);
        if (handle->transport_handle != NULL)
        {
            IoTHubTransport_Destroy(handle->transport_handle);
        }
    }
    return result;
}